

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ripser.cpp
# Opt level: O0

void __thiscall
simplex_coboundary_enumerator<compressed_distance_matrix<(compressed_matrix_layout)0>_>::
simplex_coboundary_enumerator
          (simplex_coboundary_enumerator<compressed_distance_matrix<(compressed_matrix_layout)0>_>
           *this,filtration_entry_t _simplex,index_t _dim,index_t _n,coefficient_t _modulus,
          compressed_distance_matrix<(compressed_matrix_layout)0> *_dist,
          binomial_coeff_table *_binomial_coeff)

{
  index_t iVar1;
  int in_ECX;
  int in_EDX;
  pointer in_RSI;
  vector<int,_std::allocator<int>_> *in_RDI;
  undefined2 in_R8W;
  pointer in_R9;
  pointer in_stack_00000008;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff68;
  allocator_type *in_stack_ffffffffffffff80;
  binomial_coeff_table *binomial_coeff;
  size_type in_stack_ffffffffffffff88;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> out;
  
  (in_RDI->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start =
       in_RSI;
  iVar1 = get_index((filtration_entry_t *)0x16e0b0);
  *(index_t *)
   &(in_RDI->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
    _M_finish = iVar1;
  *(undefined4 *)
   ((long)&(in_RDI->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish + 4) = 0;
  *(int *)&(in_RDI->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_end_of_storage = in_ECX + -1;
  *(int *)((long)&(in_RDI->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_end_of_storage + 4) = in_EDX + 1;
  *(undefined2 *)
   &in_RDI[1].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = in_R8W;
  in_RDI[1].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = in_stack_00000008;
  in_RDI[1].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = in_R9;
  out._M_current = (int *)(in_RDI + 2);
  std::allocator<int>::allocator((allocator<int> *)0x16e11f);
  std::vector<int,_std::allocator<int>_>::vector
            (in_RDI,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  iVar1 = (index_t)(in_stack_ffffffffffffff88 >> 0x20);
  std::allocator<int>::~allocator((allocator<int> *)0x16e13f);
  get_index((filtration_entry_t *)0x16e14c);
  binomial_coeff =
       (binomial_coeff_table *)
       in_RDI[1].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  std::vector<int,_std::allocator<int>_>::begin(in_stack_ffffffffffffff68);
  get_simplex_vertices<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((index_t)((ulong)in_RDI >> 0x20),(index_t)in_RDI,iVar1,binomial_coeff,out);
  return;
}

Assistant:

simplex_coboundary_enumerator(const filtration_entry_t _simplex, index_t _dim, index_t _n,
	                              const coefficient_t _modulus, const DistanceMatrix& _dist,
	                              const binomial_coeff_table& _binomial_coeff)
	    : simplex(_simplex), idx_below(get_index(_simplex)), idx_above(0), v(_n - 1), k(_dim + 1), modulus(_modulus),
	      binomial_coeff(_binomial_coeff), dist(_dist), vertices(_dim + 1) {
		get_simplex_vertices(get_index(_simplex), _dim, _n, binomial_coeff, vertices.begin());
	}